

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::InitDisableInlineApply(FunctionBody *this)

{
  uint uVar1;
  bool bVar2;
  LocalFunctionId LVar3;
  uint uVar4;
  
  LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  if (LVar3 != 0xffffffff) {
    uVar1 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
               m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01441eb0,InlinePhase,uVar1,LVar3);
    uVar4 = 0x1000;
    if (bVar2) goto LAB_006c65a1;
  }
  uVar1 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
             m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01441eb0,InlineApplyPhase,uVar1,LVar3);
  uVar4 = (uint)bVar2 << 0xc;
LAB_006c65a1:
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffefff | uVar4;
  return;
}

Assistant:

void FunctionBody::InitDisableInlineApply()
    {
        SetDisableInlineApply(
            (this->GetLocalFunctionId() != Js::Constants::NoFunctionId && PHASE_OFF(Js::InlinePhase, this)) ||
            PHASE_OFF(Js::InlineApplyPhase, this));
    }